

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage3d_neg_level
               (NegativeTestContext *ctx)

{
  undefined8 this;
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar2;
  ContextInfo *this_00;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  GLuint local_18;
  deUint32 textures [3];
  NegativeTestContext *ctx_local;
  
  textures._4_8_ = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,3,&local_1c);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures._4_8_,0x806f,local_1c);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)textures._4_8_,0x806f,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures._4_8_,0x8c1a,local_18);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)textures._4_8_,0x8c1a,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError((NegativeTestContext *)textures._4_8_,0);
  this = textures._4_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_INVALID_VALUE is generated if level is less than 0.",&local_41)
  ;
  NegativeTestContext::beginSection((NegativeTestContext *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glCopyTexSubImage3D((CallLogWrapper *)textures._4_8_,0x806f,-1,0,0,0,0,0,4,4)
  ;
  NegativeTestContext::expectError((NegativeTestContext *)textures._4_8_,0x501);
  glu::CallLogWrapper::glCopyTexSubImage3D((CallLogWrapper *)textures._4_8_,0x8c1a,-1,0,0,0,0,0,4,4)
  ;
  NegativeTestContext::expectError((NegativeTestContext *)textures._4_8_,0x501);
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)textures._4_8_);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar1) {
    this_00 = NegativeTestContext::getContextInfo((NegativeTestContext *)textures._4_8_);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_texture_cube_map_array");
    if (!bVar1) goto LAB_0091d8c2;
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures._4_8_,0x9009,textures[0]);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)textures._4_8_,0x9009,0,0x1908,4,4,6,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError((NegativeTestContext *)textures._4_8_,0);
  glu::CallLogWrapper::glCopyTexSubImage3D((CallLogWrapper *)textures._4_8_,0x9009,-1,0,0,0,0,0,4,4)
  ;
  NegativeTestContext::expectError((NegativeTestContext *)textures._4_8_,0x501);
LAB_0091d8c2:
  NegativeTestContext::endSection((NegativeTestContext *)textures._4_8_);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)textures._4_8_,3,&local_1c);
  return;
}

Assistant:

void copytexsubimage3d_neg_level (NegativeTestContext& ctx)
{
	deUint32	textures[3];
	ctx.glGenTextures(3, &textures[0]);
	ctx.glBindTexture(GL_TEXTURE_3D, textures[0]);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, textures[1]);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, -1, 0, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexSubImage3D(GL_TEXTURE_2D_ARRAY, -1, 0, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[2]);
		ctx.glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA, 4, 4, 6, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_NO_ERROR);
		ctx.glCopyTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, -1, 0, 0, 0, 0, 0, 4, 4);
		ctx.expectError(GL_INVALID_VALUE);
	}

	ctx.endSection();

	ctx.glDeleteTextures(3, &textures[0]);
}